

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::ArrayFeatureType::ByteSizeLong(ArrayFeatureType *this)

{
  int iVar1;
  uint32 uVar2;
  long lVar3;
  uint uVar4;
  ulong *puVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  int index;
  size_t sVar9;
  
  iVar1 = (this->shape_).current_size_;
  index = 0;
  if (iVar1 < 1) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      puVar5 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->shape_,index);
      lVar3 = 0x3f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      lVar8 = lVar8 + (ulong)((int)lVar3 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar4 = (uint)lVar8;
  if (lVar8 == 0) {
    uVar7 = 0;
  }
  else if ((int)uVar4 < 0) {
    uVar7 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar4 | 1) != 0) {
      for (; (uVar4 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  this->_shape_cached_byte_size_ = uVar4;
  sVar9 = uVar7 + lVar8;
  uVar4 = this->datatype_;
  if (uVar4 != 0) {
    if ((int)uVar4 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar7;
  }
  if (this->_oneof_case_[0] == 0x1f) {
    sVar6 = ArrayFeatureType_ShapeRange::ByteSizeLong((this->ShapeFlexibility_).shaperange_);
  }
  else {
    if (this->_oneof_case_[0] != 0x15) goto LAB_001f1a85;
    sVar6 = ArrayFeatureType_EnumeratedShapes::ByteSizeLong
                      ((this->ShapeFlexibility_).enumeratedshapes_);
  }
  uVar4 = (uint)sVar6 | 1;
  iVar1 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar9 = sVar9 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
LAB_001f1a85:
  uVar2 = this->_oneof_case_[1];
  if (uVar2 == 0x3d) {
    sVar9 = sVar9 + 10;
  }
  else if (uVar2 == 0x33) {
    sVar9 = sVar9 + 6;
  }
  else if (uVar2 == 0x29) {
    if ((this->defaultOptionalValue_).intdefaultvalue_ < 0) {
      uVar7 = 0xc;
    }
    else {
      uVar4 = (this->defaultOptionalValue_).intdefaultvalue_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    sVar9 = sVar9 + uVar7;
  }
  this->_cached_size_ = (int)sVar9;
  return sVar9;
}

Assistant:

size_t ArrayFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ArrayFeatureType)
  size_t total_size = 0;

  // repeated int64 shape = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->shape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _shape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->datatype() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->datatype());
  }

  switch (ShapeFlexibility_case()) {
    // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
    case kEnumeratedShapes: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ShapeFlexibility_.enumeratedshapes_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
    case kShapeRange: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ShapeFlexibility_.shaperange_);
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (defaultOptionalValue_case()) {
    // int32 intDefaultValue = 41;
    case kIntDefaultValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->intdefaultvalue());
      break;
    }
    // float floatDefaultValue = 51;
    case kFloatDefaultValue: {
      total_size += 2 + 4;
      break;
    }
    // double doubleDefaultValue = 61;
    case kDoubleDefaultValue: {
      total_size += 2 + 8;
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}